

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_decoder_init(pt_event_decoder *decoder,pt_config *uconfig)

{
  undefined1 local_138 [4];
  int errcode;
  pt_config config;
  pt_config *uconfig_local;
  pt_event_decoder *decoder_local;
  
  if (decoder == (pt_event_decoder *)0x0) {
    decoder_local._4_4_ = -1;
  }
  else {
    config.addr_filter.reserved[7] = (uint64_t)uconfig;
    decoder_local._4_4_ = pt_config_from_user((pt_config *)local_138,uconfig);
    if (-1 < decoder_local._4_4_) {
      *(undefined8 *)&(decoder->flags).variant = config._116_8_;
      *(undefined8 *)((long)&(decoder->flags).variant + 8) = config.flags.variant._0_8_;
      decoder_local._4_4_ =
           pt_evt_init_pkt_flags((pt_conf_flags *)&config.cpuid_0x15_ebx,&decoder->flags);
      if ((-1 < decoder_local._4_4_) &&
         (decoder_local._4_4_ = pt_pkt_decoder_init(&decoder->pacdec,(pt_config *)local_138),
         -1 < decoder_local._4_4_)) {
        decoder_local._4_4_ = pt_evt_reset(decoder);
      }
    }
  }
  return decoder_local._4_4_;
}

Assistant:

int pt_evt_decoder_init(struct pt_event_decoder *decoder,
			const struct pt_config *uconfig)
{
	struct pt_config config;
	int errcode;

	if (!decoder)
		return -pte_internal;

	errcode = pt_config_from_user(&config, uconfig);
	if (errcode < 0)
		return errcode;

	/* The user supplied decoder flags. */
	decoder->flags = config.flags;

	/* Set the flags we need for the packet decoder we use. */
	errcode = pt_evt_init_pkt_flags(&config.flags, &decoder->flags);
	if (errcode < 0)
		return errcode;

	errcode = pt_pkt_decoder_init(&decoder->pacdec, &config);
	if (errcode < 0)
		return errcode;

	return pt_evt_reset(decoder);
}